

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy.cpp
# Opt level: O0

bool fs_copy_file(string_view source,string_view dest,bool overwrite)

{
  string_view path2;
  string_view path1;
  string_view path;
  string_view path_00;
  string_view path_01;
  bool bVar1;
  byte bVar2;
  error_code eVar3;
  byte local_136;
  string_view local_130;
  size_t local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  path local_f0;
  path local_c8;
  error_code local_a0;
  string_view local_90;
  size_t local_80;
  char *local_78;
  size_t local_70;
  size_t local_68;
  size_t local_60;
  size_t local_58;
  copy_options local_4a;
  undefined1 local_48 [6];
  copy_options opt;
  error_code ec;
  undefined1 auStack_30 [7];
  bool overwrite_local;
  string_view dest_local;
  string_view source_local;
  
  dest_local._M_len = (size_t)dest._M_str;
  _auStack_30 = dest._M_len;
  dest_local._M_str = (char *)source._M_len;
  ec._M_cat._7_1_ = overwrite;
  std::error_code::error_code((error_code *)local_48);
  local_4a = none;
  if ((ec._M_cat._7_1_ & 1) != 0) {
    local_4a = overwrite_existing;
  }
  if ((ec._M_cat._7_1_ & 1) != 0) {
    local_60 = _auStack_30;
    local_58 = dest_local._M_len;
    path_01._M_str = (char *)dest_local._M_len;
    path_01._M_len = _auStack_30;
    bVar1 = fs_is_file(path_01);
    if (bVar1) {
      local_70 = _auStack_30;
      local_68 = dest_local._M_len;
      path_00._M_str = (char *)dest_local._M_len;
      path_00._M_len = _auStack_30;
      bVar1 = fs_remove(path_00);
      if (!bVar1) {
        local_80 = _auStack_30;
        local_78 = (char *)dest_local._M_len;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_90,"fs_copy_file");
        eVar3 = std::make_error_code(io_error);
        local_a0._M_cat = eVar3._M_cat;
        local_a0._M_value = eVar3._M_value;
        path._M_str = local_78;
        path._M_len = local_80;
        fs_print_error(path,local_90,&local_a0);
      }
    }
  }
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_c8,(basic_string_view<char,_std::char_traits<char>_> *)&dest_local._M_str,
             auto_format);
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_f0,(basic_string_view<char,_std::char_traits<char>_> *)auStack_30,auto_format);
  bVar2 = std::filesystem::copy_file(&local_c8,&local_f0,local_4a,(error_code *)local_48);
  local_136 = 0;
  if ((bVar2 & 1) != 0) {
    bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_48);
    local_136 = bVar1 ^ 0xff;
  }
  std::filesystem::__cxx11::path::~path(&local_f0);
  std::filesystem::__cxx11::path::~path(&local_c8);
  bVar1 = (local_136 & 1) != 0;
  if (!bVar1) {
    local_110 = dest_local._M_str;
    local_120 = _auStack_30;
    local_118 = (char *)dest_local._M_len;
    local_108 = source._M_str;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_130,"fs_copy_file");
    path1._M_str = local_108;
    path1._M_len = (size_t)local_110;
    path2._M_str = local_118;
    path2._M_len = local_120;
    fs_print_error(path1,path2,local_130,(error_code *)local_48);
  }
  return bVar1;
}

Assistant:

bool fs_copy_file(std::string_view source, std::string_view dest, bool overwrite)
{
  // copy a single file -- symlinks are followed

  std::error_code ec;

#ifdef HAVE_CXX_FILESYSTEM
  auto opt = std::filesystem::copy_options::none;
  if (overwrite)
    opt = std::filesystem::copy_options::overwrite_existing;
// WORKAROUND: Windows MinGW GCC 11..13, Intel oneAPI Linux: bug with overwrite_existing failing on overwrite

  if(overwrite && fs_is_file(dest) && !fs_remove(dest)) FFS_UNLIKELY
    fs_print_error(dest, __func__, std::make_error_code(std::errc::io_error));

  if(std::filesystem::copy_file(source, dest, opt, ec) && !ec) FFS_LIKELY
    return true;

#elif defined(_WIN32)
  DWORD opts = 0;
  if(!overwrite)
    opts |= COPY_FILE_FAIL_IF_EXISTS;

  // https://learn.microsoft.com/en-us/windows/win32/api/winbase/nf-winbase-copyfileexa
  // preserves source file attributes
  if(CopyFileExA(source.data(), dest.data(), nullptr, nullptr, FALSE, opts) != 0)
    return true;

#elif defined(HAVE_MACOS_COPYFILE)
  // https://developer.apple.com/library/archive/documentation/System/Conceptual/ManPages_iPhoneOS/man3/copyfile.3.html
  // preserves source file attributes
  auto opt = COPYFILE_ALL;
  if (!overwrite)
    opt |= COPYFILE_EXCL;

  if(copyfile(source.data(), dest.data(), nullptr, opt) == 0)
    return true;
#else

  if(fs_copy_file_range_or_loop(source, dest, overwrite)) FFS_LIKELY
    return true;

#endif

  fs_print_error(source, dest, __func__, ec);
  return false;

}